

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTSoundBank_GetNumCues(FACTSoundBank *pSoundBank,uint16_t *pnNumCues)

{
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *pnNumCues = 0;
  }
  else {
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    *pnNumCues = pSoundBank->cueCount;
    FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
  }
  return 0;
}

Assistant:

uint32_t FACTSoundBank_GetNumCues(
	FACTSoundBank *pSoundBank,
	uint16_t *pnNumCues
) {
	if (pSoundBank == NULL)
	{
		*pnNumCues = 0;
		return 0;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
	*pnNumCues = pSoundBank->cueCount;
	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}